

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_struct_desc(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "private static final org.apache.thrift.protocol.TStruct STRUCT_DESC = new org.apache.thrift.protocol.TStruct(\""
                          );
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,"\");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_struct_desc(ostream& out, t_struct* tstruct) {
  indent(out) << "private static final org.apache.thrift.protocol.TStruct STRUCT_DESC = new "
                 "org.apache.thrift.protocol.TStruct(\"" << tstruct->get_name() << "\");" << endl;
}